

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlDoc * xmlRelaxReadFile(xmlRelaxNGParserCtxtPtr ctxt,char *filename)

{
  xmlParserCtxtPtr ctxt_00;
  xmlDoc *pxVar1;
  
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    xmlRngPErrMemory(ctxt);
    pxVar1 = (xmlDoc *)0x0;
  }
  else {
    if (ctxt->serror != (xmlStructuredErrorFunc)0x0) {
      xmlCtxtSetErrorHandler(ctxt_00,ctxt->serror,ctxt->userData);
    }
    if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
      xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
    }
    pxVar1 = xmlCtxtReadFile(ctxt_00,filename,(char *)0x0,0);
    xmlFreeParserCtxt(ctxt_00);
  }
  return pxVar1;
}

Assistant:

static xmlDoc *
xmlRelaxReadFile(xmlRelaxNGParserCtxtPtr ctxt, const char *filename) {
    xmlParserCtxtPtr pctxt;
    xmlDocPtr doc;

    pctxt = xmlNewParserCtxt();
    if (pctxt == NULL) {
        xmlRngPErrMemory(ctxt);
        return(NULL);
    }
    if (ctxt->serror != NULL)
        xmlCtxtSetErrorHandler(pctxt, ctxt->serror, ctxt->userData);
    if (ctxt->resourceLoader != NULL)
        xmlCtxtSetResourceLoader(pctxt, ctxt->resourceLoader,
                                 ctxt->resourceCtxt);
    doc = xmlCtxtReadFile(pctxt, filename, NULL, 0);
    xmlFreeParserCtxt(pctxt);

    return(doc);
}